

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::double_storage>
          (undefined8 param_1,double_storage *param_2)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *this;
  double_storage temp;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffffc0;
  
  cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::double_storage>
            (in_stack_ffffffffffffffc0);
  this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
         cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::null_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::null_storage&>
            (this,(null_storage *)param_2);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::double_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::double_storage&>
            (this,param_2);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }